

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O0

void __thiscall CGameContext::OnClientPredictedInput(CGameContext *this,int ClientID,void *pInput)

{
  int iVar1;
  int iVar2;
  CConfig *pCVar3;
  char *pcVar4;
  IConsole *pIVar5;
  CGameContext *in_RDI;
  long in_FS_OFFSET;
  int unaff_retaddr;
  void *in_stack_00000008;
  int in_stack_00000014;
  CNetObjHandler *in_stack_00000018;
  int NumFailures;
  char aBuf [128];
  CNetObj_PlayerInput *in_stack_ffffffffffffff38;
  CPlayer *in_stack_ffffffffffffff40;
  char *buffer;
  char local_88 [112];
  long lVar6;
  
  lVar6 = *(long *)(in_FS_OFFSET + 0x28);
  if (((in_RDI->m_World).m_Paused & 1U) == 0) {
    iVar1 = CNetObjHandler::NumObjFailures(&in_RDI->m_NetObjHandler);
    iVar2 = CNetObjHandler::ValidateObj
                      (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr);
    if (iVar2 == -1) {
      pCVar3 = Config(in_RDI);
      if ((pCVar3->m_Debug != 0) &&
         (iVar2 = CNetObjHandler::NumObjFailures(&in_RDI->m_NetObjHandler), iVar1 != iVar2)) {
        buffer = local_88;
        pcVar4 = CNetObjHandler::FailedObjOn(&in_RDI->m_NetObjHandler);
        str_format(buffer,0x80,"NETOBJTYPE_PLAYERINPUT corrected on \'%s\'",pcVar4);
        pIVar5 = Console(in_RDI);
        (*(pIVar5->super_IInterface)._vptr_IInterface[0x19])(pIVar5,2,"server",local_88,0);
      }
    }
    else {
      CPlayer::OnPredictedInput(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar6) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CGameContext::OnClientPredictedInput(int ClientID, void *pInput)
{
	if(!m_World.m_Paused)
	{
		int NumFailures = m_NetObjHandler.NumObjFailures();
		if(m_NetObjHandler.ValidateObj(NETOBJTYPE_PLAYERINPUT, pInput, sizeof(CNetObj_PlayerInput)) == -1)
		{
			if(Config()->m_Debug && NumFailures != m_NetObjHandler.NumObjFailures())
			{
				char aBuf[128];
				str_format(aBuf, sizeof(aBuf), "NETOBJTYPE_PLAYERINPUT corrected on '%s'", m_NetObjHandler.FailedObjOn());
				Console()->Print(IConsole::OUTPUT_LEVEL_DEBUG, "server", aBuf);
			}
		}
		else
			m_apPlayers[ClientID]->OnPredictedInput((CNetObj_PlayerInput *)pInput);
	}
}